

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O0

base_learner * CSOAA::csoaa_setup(options_i *options,vw *all)

{
  long lVar1;
  undefined *puVar2;
  undefined *puVar3;
  undefined *puVar4;
  undefined *puVar5;
  undefined *puVar6;
  undefined *puVar7;
  undefined *puVar8;
  byte bVar9;
  typed_option<unsigned_int> *this;
  polyprediction *this_00;
  pointer pcVar10;
  base_learner *pbVar11;
  learner<CSOAA::csoaa,_example> *this_01;
  id in_RSI;
  long *in_RDI;
  learner<CSOAA::csoaa,_example> *l;
  option_group_definition new_options;
  free_ptr<CSOAA::csoaa> c;
  typed_option<unsigned_int> *in_stack_fffffffffffffd38;
  prediction_type_t pred_type;
  vw *in_stack_fffffffffffffd40;
  string *in_stack_fffffffffffffd48;
  single_learner *in_stack_fffffffffffffd50;
  typed_option<unsigned_int> *op;
  allocator local_249;
  string local_248 [39];
  undefined1 local_221 [40];
  allocator local_1f9;
  string local_1f8 [32];
  typed_option<unsigned_int> local_1d8;
  learner<char,_char> *in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff08;
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [56];
  undefined1 local_28 [32];
  AllReduce *local_8;
  
  local_28._16_8_ = in_RSI._M_thread;
  local_28._24_8_ = in_RDI;
  scoped_calloc_or_throw<CSOAA::csoaa>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Cost Sensitive One Against All",&local_81);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffd40,
             (string *)in_stack_fffffffffffffd38);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"csoaa",&local_1f9);
  std::unique_ptr<CSOAA::csoaa,_void_(*)(void_*)>::operator->
            ((unique_ptr<CSOAA::csoaa,_void_(*)(void_*)> *)0x38210c);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffffd48,(uint *)in_stack_fffffffffffffd40)
  ;
  this = VW::config::typed_option<unsigned_int>::keep(&local_1d8,true);
  op = (typed_option<unsigned_int> *)local_221;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_221 + 1),"One-against-all multiclass with <k> costs",(allocator *)op);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffffd40,
             (string *)in_stack_fffffffffffffd38);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  pred_type = (prediction_type_t)((ulong)in_stack_fffffffffffffd38 >> 0x20);
  VW::config::option_group_definition::add<unsigned_int>((option_group_definition *)this,op);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffffd40);
  std::__cxx11::string::~string((string *)(local_221 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_221);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffffd40);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  (*(code *)**(undefined8 **)local_28._24_8_)(local_28._24_8_,local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"csoaa",&local_249);
  bVar9 = (**(code **)(*(long *)local_28._24_8_ + 8))(local_28._24_8_,local_248);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  if (((bVar9 ^ 0xff) & 1) == 0) {
    std::unique_ptr<CSOAA::csoaa,_void_(*)(void_*)>::operator->
              ((unique_ptr<CSOAA::csoaa,_void_(*)(void_*)> *)0x382442);
    this_00 = calloc_or_throw<polyprediction>(in_stack_ffffffffffffff08);
    pcVar10 = std::unique_ptr<CSOAA::csoaa,_void_(*)(void_*)>::operator->
                        ((unique_ptr<CSOAA::csoaa,_void_(*)(void_*)> *)0x38245f);
    pcVar10->pred = this_00;
    pbVar11 = setup_base((options_i *)in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    in_stack_fffffffffffffd50 = LEARNER::as_singleline<char,char>(in_stack_ffffffffffffff00);
    in_stack_fffffffffffffd40 = (vw *)local_28;
    std::unique_ptr<CSOAA::csoaa,_void_(*)(void_*)>::operator->
              ((unique_ptr<CSOAA::csoaa,_void_(*)(void_*)> *)0x3824a6);
    this_01 = LEARNER::init_learner<CSOAA::csoaa,example,LEARNER::learner<char,example>>
                        ((free_ptr<CSOAA::csoaa> *)&this_00->scalars,
                         (learner<char,_example> *)pbVar11,
                         (_func_void_csoaa_ptr_learner<char,_example>_ptr_example_ptr *)
                         in_stack_fffffffffffffd50,
                         (_func_void_csoaa_ptr_learner<char,_example>_ptr_example_ptr *)
                         in_stack_fffffffffffffd48,(size_t)in_stack_fffffffffffffd40,pred_type);
    lVar1 = *(long *)(local_28._16_8_ + 8);
    *(undefined8 *)(lVar1 + 0x370) = DAT_00476c88;
    puVar8 = PTR_test_label_00476c80;
    puVar7 = PTR_weight_00476c70;
    puVar6 = PTR_delete_label_00476c68;
    puVar5 = PTR_read_cached_label_00476c60;
    puVar4 = PTR_cache_label_00476c58;
    puVar3 = PTR_parse_label_00476c50;
    puVar2 = COST_SENSITIVE::cs_label;
    *(undefined **)(lVar1 + 0x360) = PTR_copy_label_00476c78;
    *(undefined **)(lVar1 + 0x368) = puVar8;
    *(undefined **)(lVar1 + 0x350) = puVar6;
    *(undefined **)(lVar1 + 0x358) = puVar7;
    *(undefined **)(lVar1 + 0x340) = puVar4;
    *(undefined **)(lVar1 + 0x348) = puVar5;
    *(undefined **)(lVar1 + 0x330) = puVar2;
    *(undefined **)(lVar1 + 0x338) = puVar3;
    *(undefined4 *)(local_28._16_8_ + 0x3650) = 3;
    LEARNER::learner<CSOAA::csoaa,_example>::set_finish_example(this_01,finish_example);
    LEARNER::learner<CSOAA::csoaa,_example>::set_finish
              ((learner<CSOAA::csoaa,_example> *)&this_00->scalars,(_func_void_csoaa_ptr *)pbVar11);
    pbVar11 = LEARNER::make_base<CSOAA::csoaa,example>(this_01);
    *(base_learner **)(local_28._16_8_ + 0x38) = pbVar11;
    local_8 = *(AllReduce **)(local_28._16_8_ + 0x38);
  }
  else {
    local_8 = (AllReduce *)0x0;
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffd40);
  std::unique_ptr<CSOAA::csoaa,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<CSOAA::csoaa,_void_(*)(void_*)> *)in_stack_fffffffffffffd50);
  return (base_learner *)local_8;
}

Assistant:

base_learner* csoaa_setup(options_i& options, vw& all)
{
  auto c = scoped_calloc_or_throw<csoaa>();
  option_group_definition new_options("Cost Sensitive One Against All");
  new_options.add(make_option("csoaa", c->num_classes).keep().help("One-against-all multiclass with <k> costs"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("csoaa"))
    return nullptr;

  c->pred = calloc_or_throw<polyprediction>(c->num_classes);

  learner<csoaa, example>& l = init_learner(c, as_singleline(setup_base(*all.options, all)), predict_or_learn<true>,
      predict_or_learn<false>, c->num_classes, prediction_type::multiclass);
  all.p->lp = cs_label;
  all.label_type = label_type::cs;

  l.set_finish_example(finish_example);
  l.set_finish(finish);
  all.cost_sensitive = make_base(l);
  return all.cost_sensitive;
}